

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx2::create_pipeline_int8_x86(InnerProduct_x86_avx2 *this,Option *opt)

{
  Mat *this_00;
  uint _h;
  _func_int *p_Var1;
  size_t _elemsize;
  int _w;
  Layer *pLVar2;
  _func_int **pp_Var3;
  byte bVar4;
  void *pvVar5;
  ulong uVar6;
  int j;
  size_t sVar7;
  ulong uVar8;
  int _elempack;
  ulong uVar9;
  ParamDict pd;
  size_t local_68;
  int local_4c;
  
  pp_Var3 = this->_vptr_InnerProduct_x86_avx2;
  p_Var1 = pp_Var3[-3];
  switch(*(undefined4 *)(p_Var1 + 0x38 + (long)&(this->weight_data_int8).data)) {
  case 1:
    pLVar2 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
    break;
  case 2:
    pLVar2 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(p_Var1 + 0x40 + (long)&(this->weight_data_int8).data));
    (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
    break;
  case 3:
    pLVar2 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(p_Var1 + 0x40 + (long)&(this->weight_data_int8).data));
    ParamDict::set(&pd,1,*(float *)(*(long *)(p_Var1 + 0x40 + (long)&(this->weight_data_int8).data)
                                   + 4));
    (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
    break;
  case 4:
    pLVar2 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
    break;
  case 5:
    pLVar2 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
    break;
  case 6:
    pLVar2 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(p_Var1 + 0x40 + (long)&(this->weight_data_int8).data));
    ParamDict::set(&pd,1,*(float *)(*(long *)(p_Var1 + 0x40 + (long)&(this->weight_data_int8).data)
                                   + 4));
    (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
    break;
  default:
    pLVar2 = (Layer *)0x0;
    goto LAB_001bb351;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar2->_vptr_Layer[4])(pLVar2,opt);
  pp_Var3 = this->_vptr_InnerProduct_x86_avx2;
LAB_001bb351:
  this->activation = pLVar2;
  this_00 = (Mat *)(pp_Var3[-3] + 0x40 + (long)&(this->scales_in).data);
  _h = this_00[-2].h;
  uVar9 = (long)this_00[-2].c / (long)(int)_h;
  _w = (int)uVar9;
  bVar4 = (_h & 7) == 0 & opt->use_packing_layout;
  _elemsize = 8;
  if (bVar4 == 0) {
    _elemsize = 1;
  }
  uVar8 = 0;
  Mat::reshape((Mat *)&pd,this_00,_w,_h,(Allocator *)0x0);
  _elempack = (int)_elemsize;
  Mat::create(&this->weight_data_int8,_w,
              *(int *)(this->_vptr_InnerProduct_x86_avx2[-3] + 0x28 +
                      (long)&(this->weight_data_int8).data) / _elempack,_elemsize,_elempack,
              (Allocator *)0x0);
  pp_Var3 = this->_vptr_InnerProduct_x86_avx2;
  uVar9 = uVar9 & 0xffffffff;
  if (_w < 1) {
    uVar9 = uVar8;
  }
  for (; (long)(uVar8 + (_elempack - 1)) <
         (long)*(int *)(pp_Var3[-3] + 0x28 + (long)&(this->weight_data_int8).data);
      uVar8 = uVar8 + _elemsize) {
    pvVar5 = (void *)((ulong)((uint)uVar8 >> bVar4 * '\x03') * (long)(this->weight_data_int8).w *
                      (this->weight_data_int8).elemsize + (long)(this->weight_data_int8).data);
    for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
      for (sVar7 = 0; _elemsize != sVar7; sVar7 = sVar7 + 1) {
        *(undefined1 *)((long)pvVar5 + sVar7) =
             *(undefined1 *)
              ((long)pd._vptr_ParamDict + uVar6 + (long)local_4c * (uVar8 + sVar7) * local_68);
      }
      pvVar5 = (void *)((long)pvVar5 + sVar7);
    }
  }
  Mat::~Mat((Mat *)&pd);
  return 0;
}

Assistant:

int InnerProduct_x86_avx2::create_pipeline_int8_x86(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_int8.create(num_input, num_output / out_elempack, (size_t)out_elempack, out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g0 = weight_data_int8.row<signed char>(q / out_elempack);

            for (int p = 0; p < num_input; p++)
            {
                for (int j = 0; j < out_elempack; j++)
                {
                    *g0++ = weight_data_r2.row<signed char>(q + j)[p];
                }
            }
        }
    }

    return 0;
}